

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O2

void __thiscall axl::sys::TlsMgr::~TlsMgr(TlsMgr *this)

{
  Page *this_00;
  
  this_00 = findCurrentThreadPage(this);
  if (this_00 != (Page *)0x0) {
    Page::~Page(this_00);
    operator_delete(this_00);
    setCurrentThreadPage(this,(Page *)0x0);
  }
  pthread_key_delete(this->m_tlsKey);
  return;
}

Assistant:

TlsMgr::~TlsMgr() {
	Page* page = findCurrentThreadPage();
	if (page) {
		delete page;
		setCurrentThreadPage(NULL);
	}

	::pthread_key_delete(m_tlsKey);
}